

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servlk.cpp
# Opt level: O2

LocaleKey *
icu_63::LocaleKey::createWithCanonicalFallback
          (UnicodeString *primaryID,UnicodeString *canonicalFallbackID,int32_t kind,
          UErrorCode *status)

{
  LocaleKey *this;
  UnicodeString *result;
  UnicodeString canonicalPrimaryID;
  UnicodeString local_60;
  
  this = (LocaleKey *)0x0;
  if ((primaryID != (UnicodeString *)0x0) && (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    result = &local_60;
    local_60.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00245838;
    local_60.fUnion.fStackFields.fLengthAndFlags = 2;
    LocaleUtility::canonicalLocaleString(primaryID,result);
    this = (LocaleKey *)UMemory::operator_new((UMemory *)0x110,(size_t)result);
    if (this != (LocaleKey *)0x0) {
      LocaleKey(this,primaryID,&local_60,canonicalFallbackID,kind);
    }
    UnicodeString::~UnicodeString(&local_60);
  }
  return this;
}

Assistant:

LocaleKey*
LocaleKey::createWithCanonicalFallback(const UnicodeString* primaryID,
                                       const UnicodeString* canonicalFallbackID,
                                       int32_t kind,
                                       UErrorCode& status)
{
    if (primaryID == NULL || U_FAILURE(status)) {
        return NULL;
    }
    UnicodeString canonicalPrimaryID;
    LocaleUtility::canonicalLocaleString(primaryID, canonicalPrimaryID);
    return new LocaleKey(*primaryID, canonicalPrimaryID, canonicalFallbackID, kind);
}